

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O3

void FRemapTable::StaticSerializeTranslations(FSerializer *arc)

{
  bool bVar1;
  uint uVar2;
  ulong in_RAX;
  FRemapTable *pFVar3;
  ulong uVar4;
  long lVar5;
  int w;
  undefined8 local_38;
  
  local_38 = in_RAX;
  bVar1 = FSerializer::BeginArray(arc,"translations");
  if (bVar1) {
    if (arc->w == (FWriter *)0x0) {
      bVar1 = FSerializer::BeginObject(arc,(char *)0x0);
      if (bVar1) {
        do {
          ::Serialize(arc,"index",(int32_t *)((long)&local_38 + 4),(int32_t *)0x0);
          if ((translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count <=
               local_38._4_4_) ||
             (pFVar3 = translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array
                       [local_38._4_4_].Ptr, pFVar3 == (FRemapTable *)0x0)) {
            pFVar3 = (FRemapTable *)operator_new(0x20);
            pFVar3->Inactive = false;
            Alloc(pFVar3,0x100);
            lVar5 = (long)(int)local_38._4_4_;
            if (-1 < lVar5) {
              if (translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count <=
                  local_38._4_4_) {
                TArray<FRemapTablePtr,_FRemapTable_*>::Resize
                          (&translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                           local_38._4_4_ + 1);
              }
              translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[lVar5].Ptr =
                   pFVar3;
            }
          }
          Serialize(pFVar3,arc);
          FSerializer::EndObject(arc);
          bVar1 = FSerializer::BeginObject(arc,(char *)0x0);
        } while (bVar1);
      }
    }
    else {
      local_38 = local_38 & 0xffffffff00000000;
      if (translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count != 0) {
        uVar2 = 0;
        do {
          pFVar3 = translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[uVar2].Ptr
          ;
          if (pFVar3 != (FRemapTable *)0x0) {
            if (*pFVar3->Remap == '\0') {
              uVar4 = 0;
              do {
                if (uVar4 == 0xff) goto LAB_003329b0;
                lVar5 = uVar4 + 1;
                uVar4 = uVar4 + 1;
              } while (uVar4 == pFVar3->Remap[lVar5]);
            }
            bVar1 = FSerializer::BeginObject(arc,(char *)0x0);
            if (bVar1) {
              ::Serialize(arc,"index",(uint32_t *)&local_38,(uint32_t *)0x0);
              Serialize(pFVar3,arc);
              FSerializer::EndObject(arc);
            }
          }
LAB_003329b0:
          uVar2 = (uint32_t)local_38 + 1;
          local_38 = CONCAT44(local_38._4_4_,uVar2);
        } while (uVar2 < translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count);
      }
    }
    FSerializer::EndArray(arc);
  }
  return;
}

Assistant:

void FRemapTable::StaticSerializeTranslations(FSerializer &arc)
{
	if (arc.BeginArray("translations"))
	{
		// Does this level have custom translations?
		FRemapTable *trans;
		int w;
		if (arc.isWriting())
		{
			for (unsigned int i = 0; i < translationtables[TRANSLATION_LevelScripted].Size(); ++i)
			{
				trans = translationtables[TRANSLATION_LevelScripted][i];
				if (trans != NULL && !trans->IsIdentity())
				{
					if (arc.BeginObject(nullptr))
					{
						arc("index", i);
						trans->Serialize(arc);
						arc.EndObject();
					}
				}
			}
		}
		else
		{
			while (arc.BeginObject(nullptr))
			{
				arc("index", w);
				trans = translationtables[TRANSLATION_LevelScripted].GetVal(w);
				if (trans == NULL)
				{
					trans = new FRemapTable;
					translationtables[TRANSLATION_LevelScripted].SetVal(w, trans);
				}
				trans->Serialize(arc);
				arc.EndObject();
			}
		}
		arc.EndArray();
	}
}